

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O3

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  char *args;
  undefined4 in_register_00000034;
  long lVar2;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  args = mnemonic(*(Opcode *)(lVar2 + 0x40));
  printf<char_const*>(this,"BinaryExpr: %s\n",args);
  this->depth_ = this->depth_ + 1;
  printf(this,"lhs:\n");
  this->depth_ = this->depth_ + 1;
  (**(code **)(**(long **)(lVar2 + 0x48) + 0x10))(*(long **)(lVar2 + 0x48),this);
  this->depth_ = this->depth_ + -1;
  printf(this,"rhs:\n");
  this->depth_ = this->depth_ + 1;
  iVar1 = (**(code **)(**(long **)(lVar2 + 0x50) + 0x10))(*(long **)(lVar2 + 0x50),this);
  this->depth_ = this->depth_ + -2;
  return iVar1;
}

Assistant:

void ASTPrinter::accept(BinaryExpr& expr) {
  printf("BinaryExpr: %s\n", mnemonic(expr.op()));
  enter();
  printf("lhs:\n");
  enter();
  expr.leftExpr()->visit(*this);
  leave();
  leave();
  enter();
  printf("rhs:\n");
  enter();
  expr.rightExpr()->visit(*this);
  leave();
  leave();
}